

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

QAction * __thiscall QMenuBarPrivate::getNextAction(QMenuBarPrivate *this,int _start,int increment)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QWidget *this_00;
  QRect *pQVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  QStyle *pQVar7;
  uint uVar8;
  QAction *pQVar9;
  QAction *pQVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  
  lVar11 = (long)increment;
  do {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    updateGeometries(this);
    pQVar7 = QWidget::style(this_00);
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0xe,0,this_00,0);
    uVar8 = increment & _start;
    uVar6 = _start;
    if (uVar8 == 0xffffffff) {
      uVar6 = (uint)(this->super_QWidgetPrivate).actions.d.size;
    }
    if (increment == -1) {
      lVar12 = 0;
    }
    else {
      uVar8 = (int)(this->super_QWidgetPrivate).actions.d.size - 1;
      lVar12 = (long)(int)uVar8;
    }
    lVar13 = (lVar12 + lVar11) - (long)(int)uVar6;
    lVar12 = ((int)uVar6 + lVar11) * 8;
    pQVar9 = (QAction *)(ulong)uVar8;
    do {
      lVar13 = lVar13 - lVar11;
      pQVar10 = pQVar9;
      if (lVar13 == 0) break;
      pQVar3 = (this->actionRects).d.ptr;
      uVar1 = *(undefined8 *)((long)&(pQVar3->x1).m_i + lVar12 * 2);
      uVar2 = *(undefined8 *)((long)&(pQVar3->x2).m_i + lVar12 * 2);
      iVar16 = -(uint)((int)uVar2 == (int)uVar1 + -1);
      iVar17 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) + -1);
      auVar15._4_4_ = iVar16;
      auVar15._0_4_ = iVar16;
      auVar15._8_4_ = iVar17;
      auVar15._12_4_ = iVar17;
      iVar16 = movmskpd((int)pQVar3,auVar15);
      if ((iVar16 == 3) ||
         ((pQVar10 = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar12),
          iVar5 == 0 && (cVar4 = QAction::isEnabled(), cVar4 == '\0')))) {
        bVar14 = true;
        pQVar10 = pQVar9;
      }
      else {
        bVar14 = false;
      }
      lVar12 = lVar12 + lVar11 * 8;
      pQVar9 = pQVar10;
    } while (bVar14);
    if (lVar13 != 0) {
      return pQVar10;
    }
    bVar14 = _start == 0xffffffff;
    _start = 0xffffffff;
    if (bVar14) {
      return (QAction *)0x0;
    }
  } while( true );
}

Assistant:

QAction *QMenuBarPrivate::getNextAction(const int _start, const int increment) const
{
    Q_Q(const QMenuBar);
    const_cast<QMenuBarPrivate*>(this)->updateGeometries();
    bool allowActiveAndDisabled = q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    const int start = (_start == -1 && increment == -1) ? actions.size() : _start;
    const int end =  increment == -1 ? 0 : actions.size() - 1;

    for (int i = start; i != end;) {
        i += increment;
        QAction *current = actions.at(i);
        if (!actionRects.at(i).isNull() && (allowActiveAndDisabled || current->isEnabled()))
            return current;
    }

    if (_start != -1) //let's try from the beginning or the end
        return getNextAction(-1, increment);

    return nullptr;
}